

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

void map_entry_destroy(map *map,map_entry *entry)

{
  if (((entry != (map_entry *)0x0) && (entry->key != (void *)0x0)) &&
     ((int *)entry->value != &EMPTY_ENTRY)) {
    if ((map->setting_flags & MAP_FLAG_FREE_ENTRY_KEY) != 0) {
      free(entry->key);
    }
    if ((map->setting_flags & MAP_FLAG_USE_FREE) != 0) {
      free(entry->value);
    }
    if (((map->setting_flags & MAP_FLAG_USE_FREE_FUNC) != 0) &&
       (map->free_function != (map_entry_free_function_t)0x0)) {
      (*map->free_function)(entry->value);
    }
  }
  free(entry);
  return;
}

Assistant:

void map_entry_destroy(const struct map *map, struct map_entry *entry)
{
        if (is_entry_present(entry)) {
                if (map->setting_flags & MAP_FLAG_FREE_ENTRY_KEY) {
                        free((void *)entry->key);
                }

                if (map->setting_flags & MAP_FLAG_USE_FREE) {
                        free(entry->value);
                }

                if (map->setting_flags & MAP_FLAG_USE_FREE_FUNC) {
                        if (map->free_function == NULL) {
                                free(entry);

                                return;
                        }

                        map->free_function(entry->value);
                }
        }

        free(entry);
}